

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::sync(Rdma *this)

{
  ActionBuf *this_00;
  PushPopCommBuf *this_01;
  ActionBuf *this_02;
  pointer ppvVar1;
  uint in_ESI;
  Rdma *__stat_loc;
  
  this_00 = &this->m_send_actions;
  (this->m_send_actions).m_dummy_bsmp = in_ESI;
  ActionBuf::set_get_buffer_offset(this_00,&this->m_second_exchange);
  PushPopCommBuf::serialize(&this->m_send_push_pop_comm_buf,&this->m_first_exchange);
  ActionBuf::serialize(this_00,&this->m_first_exchange);
  A2A::exchange(&this->m_first_exchange);
  this_01 = &this->m_recv_push_pop_comm_buf;
  PushPopCommBuf::deserialize(this_01,&this->m_first_exchange);
  this_02 = &this->m_recv_actions;
  ActionBuf::deserialize(this_02,&this->m_first_exchange);
  __stat_loc = this;
  ActionBuf::execute(this_02,this);
  Unbuf::start(&this->m_unbuf);
  A2A::exchange(&this->m_second_exchange);
  write_gets(this);
  write_puts(this);
  Unbuf::wait(&this->m_unbuf,__stat_loc);
  PushPopCommBuf::execute(this_01,this);
  PushPopCommBuf::clear(&this->m_send_push_pop_comm_buf);
  PushPopCommBuf::clear(this_01);
  ActionBuf::clear(this_00);
  ActionBuf::clear(this_02);
  ppvVar1 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar1) {
    (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar1;
  }
  return;
}

Assistant:

bool Rdma::sync(bool dummy_bsmp)
{
    m_send_actions.set_dummy_bsmp(dummy_bsmp);
    m_send_actions.set_get_buffer_offset( m_second_exchange );

    // first exchange: gets, unbuffered requests, push/pop registers
    m_send_push_pop_comm_buf.serialize( m_first_exchange );
    m_send_actions.serialize( m_first_exchange );
   
    m_first_exchange.exchange( );

    m_recv_push_pop_comm_buf.deserialize( m_first_exchange );
    m_recv_actions.deserialize( m_first_exchange );
   
    m_recv_actions.execute(*this);
    
    // start the unbuffered requests
    m_unbuf.start();

    // perform the buffered puts (which includes the buffered gets)
    m_second_exchange.exchange( );
    write_gets();
    write_puts() ;

    // wait for the unbuffered requests to finish
    m_unbuf.wait();

    // execute the push/pop registers
    m_recv_push_pop_comm_buf.execute(*this);

    bool all_dummy_bsmp = m_recv_actions.get_dummy_bsmp();
    // reset to initial state
    m_send_push_pop_comm_buf.clear();
    m_recv_push_pop_comm_buf.clear();
    m_send_actions.clear();
    m_recv_actions.clear();
    m_local_slots.clear();
    return all_dummy_bsmp;
}